

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

bool __thiscall ON_Annotation::GetText3dCorners(ON_Annotation *this,ON_3dPoint *corners)

{
  ON_TextContent *this_00;
  ON_TextContent *text_geom;
  ON_3dPoint *corners_local;
  ON_Annotation *this_local;
  
  if (corners == (ON_3dPoint *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = Text(this);
    if (this_00 == (ON_TextContent *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = ON_TextContent::Get3dCorners(this_00,corners);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Annotation::GetText3dCorners(ON_3dPoint corners[4]) const
{
  if (nullptr == corners)
    return false;
  const ON_TextContent* text_geom = Text();
  if (nullptr == text_geom)
    return false;
  return text_geom->Get3dCorners(corners);
}